

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O0

int ConvolutionReverb::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  long lVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float next_val;
  int i;
  float next_time;
  int n;
  float time_scale;
  float prev_val;
  float scale;
  float *src;
  int index;
  MutexScopeLock local_40;
  MutexScopeLock mutexScope;
  EffectData *data;
  int numsamples_local;
  float *buffer_local;
  char *name_local;
  UnityAudioEffectState *state_local;
  
  mutexScope.mutex =
       (Mutex *)UnityAudioEffectState::GetEffectData<ConvolutionReverb::EffectData>(state);
  MutexScopeLock::MutexScopeLock(&local_40,((EffectData *)mutexScope.mutex)->mutex,true);
  iVar2 = strncmp(name,"Impulse",7);
  if (iVar2 == 0) {
    SetupImpulse((EffectData *)mutexScope.mutex,mutexScope.mutex[1].mutex.__data.__nusers,
                 *(int *)((long)&mutexScope.mutex[1].mutex + 0x18),
                 *(int *)((long)&mutexScope.mutex[1].mutex + 0x24));
    if (name[7] + -0x30 < (int)mutexScope.mutex[1].mutex.__data.__nusers) {
      lVar1 = *(long *)(*(long *)((long)&mutexScope.mutex[3].mutex + 0x10) +
                        (long)(name[7] + -0x30) * 0x20 + 0x10);
      fVar3 = (float)(*(int *)((long)&mutexScope.mutex[1].mutex + 0x18) *
                      mutexScope.mutex[1].mutex.__data.__kind + -2) / (float)numsamples;
      n = 0;
      for (i = 0; i < numsamples; i = i + 1) {
        fVar4 = (float)i * fVar3;
        iVar2 = FastFloor(fVar4);
        fVar4 = (*(float *)(lVar1 + (long)(iVar2 + 1) * 4) - *(float *)(lVar1 + (long)iVar2 * 4)) *
                (fVar4 - (float)iVar2) + *(float *)(lVar1 + (long)iVar2 * 4);
        buffer[i] = (fVar4 - (float)n) * (1.0 / fVar3);
        n = (int)fVar4;
      }
    }
  }
  MutexScopeLock::~MutexScopeLock(&local_40);
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        MutexScopeLock mutexScope(*data->mutex);
        if (strncmp(name, "Impulse", 7) == 0)
        {
            SetupImpulse(data, data->numchannels, data->hopsize, data->samplerate);
            int index = name[7] - '0';
            if (index >= data->numchannels)
                return UNITY_AUDIODSP_OK;
            const float* src = data->channels[index].impulse;
            float scale = (float)(data->hopsize * data->numpartitions - 2) / (float)numsamples;
            float prev_val = 0.0f, time_scale = 1.0f / scale;
            for (int n = 0; n < numsamples; n++)
            {
                // resample pre-integrated curve via box-filtering: f(x) = (F(x+dx)-F(x)) / dx
                float next_time = n * scale;
                int i = FastFloor(next_time);
                float next_val = src[i] + (src[i + 1] - src[i]) * (next_time - i);
                buffer[n] = (next_val - prev_val) * time_scale;
                prev_val = next_val;
            }
        }
        return UNITY_AUDIODSP_OK;
    }